

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptint.c
# Opt level: O0

int POPT_fprintf(FILE *stream,char *format,...)

{
  char in_AL;
  char *__ptr;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  ulong local_110;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  size_t local_50;
  size_t nb;
  va_list ap;
  int rc;
  char *ob;
  char *b;
  char *format_local;
  FILE *stream_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  ob = (char *)0x0;
  local_50 = 1;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  while (ob = (char *)realloc(ob,local_50 + 1), ob != (char *)0x0) {
    ap[0].overflow_arg_area = local_108;
    ap[0]._0_8_ = &stack0x00000008;
    nb._4_4_ = 0x30;
    nb._0_4_ = 0x10;
    ap[0].reg_save_area._4_4_ = vsnprintf(ob,local_50,format,&nb);
    if (ap[0].reg_save_area._4_4_ < 0) {
      if (local_50 < 100) {
        local_110 = 100;
      }
      else {
        local_110 = local_50;
      }
      local_50 = local_110 + local_50;
    }
    else {
      if ((ulong)(long)ap[0].reg_save_area._4_4_ < local_50) break;
      local_50 = (size_t)(ap[0].reg_save_area._4_4_ + 1);
    }
  }
  ap[0].reg_save_area._4_4_ = 0;
  if (ob != (char *)0x0) {
    __ptr = strdup_locale_from_utf8(ob);
    if (__ptr == (char *)0x0) {
      ap[0].reg_save_area._4_4_ = fprintf((FILE *)stream,"%s",ob);
    }
    else {
      ap[0].reg_save_area._4_4_ = fprintf((FILE *)stream,"%s",__ptr);
      free(__ptr);
    }
    free(ob);
  }
  return ap[0].reg_save_area._4_4_;
}

Assistant:

int
POPT_fprintf (FILE * stream, const char * format, ...)
{
    char * b = NULL, * ob = NULL;
    int rc;
    va_list ap;

#if defined(HAVE_VASPRINTF)
    va_start(ap, format);
    if ((rc = vasprintf(&b, format, ap)) < 0)
	b = NULL;
    va_end(ap);
#else
    size_t nb = (size_t)1;

    /* HACK: add +1 to the realloc no. of bytes "just in case". */
    /* XXX Likely unneeded, the issues wrto vsnprintf(3) return b0rkage have
     * to do with whether the final '\0' is counted (or not). The code
     * below already adds +1 for the (possibly already counted) trailing NUL.
     */
    while ((b = realloc(b, nb+1)) != NULL) {
	va_start(ap, format);
	rc = vsnprintf(b, nb, format, ap);
	va_end(ap);
	if (rc > -1) {	/* glibc 2.1 */
	    if ((size_t)rc < nb)
		break;
	    nb = (size_t)(rc + 1);	/* precise buffer length known */
	} else 		/* glibc 2.0 */
	    nb += (nb < (size_t)100 ? (size_t)100 : nb);
	ob = b;
    }
#endif

    rc = 0;
    if (b != NULL) {
#ifdef HAVE_ICONV
	ob = strdup_locale_from_utf8(b);
	if (ob != NULL) {
	    rc = fprintf(stream, "%s", ob);
	    free(ob);
	} else
#endif
	    rc = fprintf(stream, "%s", b);
	free (b);
    }

    return rc;
}